

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O2

Box * __thiscall
libDAI::Box::boundSumProd
          (Box *__return_storage_ptr__,Box *this,Factor *psi,VarSet *dest,bool normed)

{
  long lVar1;
  ulong uVar2;
  Prob image_ep;
  Prob image_max;
  Prob image_min;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> ep;
  TFactor<double> local_d8;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  extremePoints(&ep,this);
  TProb<double>::TProb(&image_min,dest->_statespace,INFINITY);
  TProb<double>::TProb(&image_max,dest->_statespace,-INFINITY);
  lVar1 = 0;
  uVar2 = 0;
  while( true ) {
    if ((ulong)(((long)ep.
                       super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)ep.
                      super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar2) break;
    image_ep._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    image_ep._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    image_ep._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    TFactor<double>::TFactor
              (&local_a0,&this->_vars,
               (TProb<double> *)
               ((long)&((ep.
                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_p).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar1));
    TFactor<double>::operator*(&local_68,psi,&local_a0);
    TFactor<double>::marginal(&local_d8,&local_68,dest,normed);
    TProb<double>::operator=(&image_ep,&local_d8._p);
    TFactor<double>::~TFactor(&local_d8);
    TFactor<double>::~TFactor(&local_68);
    TFactor<double>::~TFactor(&local_a0);
    min<double>((TProb<double> *)&local_d8,&image_ep,&image_min);
    TProb<double>::operator=(&image_min,(TProb<double> *)&local_d8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_d8);
    max<double>((TProb<double> *)&local_d8,&image_ep,&image_max);
    TProb<double>::operator=(&image_max,(TProb<double> *)&local_d8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_d8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&image_ep);
    uVar2 = uVar2 + 1;
    lVar1 = lVar1 + 0x18;
  }
  Box(__return_storage_ptr__,dest,&image_min,&image_max);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&image_max);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&image_min);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector(&ep);
  return __return_storage_ptr__;
}

Assistant:

Box boundSumProd(Factor psi, VarSet dest, bool normed) const {
                // FIXME: do we have to store the extreme points?
                std::vector<Prob> ep = extremePoints();
                Prob image_min( dest.stateSpace(), INFINITY );
                Prob image_max( dest.stateSpace(), -INFINITY );
                for( size_t l = 0; l < ep.size(); l++ ) {
                    // FIXME: this can be sped up massively by caching the index
                    Prob image_ep;
                    image_ep = (psi * Factor(_vars,ep[l])).marginal(dest,normed).p();
                    image_min = libDAI::min( image_ep, image_min );
                    image_max = libDAI::max( image_ep, image_max );
                }
                return Box( dest, image_min, image_max );
            }